

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall QPDFWriter::writePad(QPDFWriter *this,size_t nspaces)

{
  size_t in_RCX;
  long *local_38;
  void *local_30;
  long local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct((ulong)&local_38,(char)nspaces);
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,(int)local_38,local_30,in_RCX);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

void
QPDFWriter::writePad(size_t nspaces)
{
    writeString(std::string(nspaces, ' '));
}